

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateCopyLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  size_t __n;
  bool bVar4;
  int iVar5;
  LogMessage *pLVar6;
  long *plVar7;
  size_type *psVar8;
  string err;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  undefined1 local_98 [40];
  pointer local_70;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Result::Result((Result *)&local_70);
  validateInputCount((Result *)local_a8,layer,1,1);
  local_70 = (pointer)local_a8;
  std::__cxx11::string::operator=((string *)&local_68,(string *)&local_a0);
  if (local_a0._M_p != local_98 + 8) {
    operator_delete(local_a0._M_p,local_98._8_8_ + 1);
  }
  bVar4 = Result::good((Result *)&local_70);
  if (bVar4) {
    validateOutputCount((Result *)local_a8,layer,1,1);
    local_70 = (pointer)local_a8;
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_a0);
    if (local_a0._M_p != local_98 + 8) {
      operator_delete(local_a0._M_p,local_98._8_8_ + 1);
    }
  }
  if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar6 = google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)local_a8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_48,pLVar6);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a8);
  }
  puVar2 = (undefined8 *)((layer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar6 = google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)local_a8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_48,pLVar6);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a8);
  }
  puVar3 = (undefined8 *)((layer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  __n = puVar2[1];
  if (__n == puVar3[1]) {
    if (__n != 0) {
      iVar5 = bcmp((void *)*puVar2,(void *)*puVar3,__n);
      if (iVar5 != 0) goto LAB_002cf61d;
    }
    std::operator+(&local_48,"Copy layer \'",(layer->name_).ptr_);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_48);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar8) {
      local_98._0_8_ = *psVar8;
      local_98._8_8_ = plVar7[3];
      local_a8 = (undefined1  [8])local_98;
    }
    else {
      local_98._0_8_ = *psVar8;
      local_a8 = (undefined1  [8])*plVar7;
    }
    local_a0._M_p = (pointer)plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
    if (local_a8 != (undefined1  [8])local_98) {
      operator_delete((void *)local_a8,local_98._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p != &local_58) {
      operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
    }
  }
  else {
LAB_002cf61d:
    *(pointer *)__return_storage_ptr__ = local_70;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p == &local_58) {
      paVar1->_M_allocated_capacity = local_58._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_58._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_68._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           local_58._M_allocated_capacity;
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_60;
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateCopyLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    if (layer.input(0) == layer.output(0)) {
        const std::string err = "Copy layer '" + layer.name() + "' has identical input and output names.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return r;
}